

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlCatalogEntryType xVar1;
  _xmlCatalogEntry *ctx;
  xmlGenericErrorFunc p_Var2;
  bool bVar3;
  _xmlCatalogEntry **pp_Var4;
  int iVar5;
  uint len;
  int iVar6;
  xmlChar *pxVar7;
  xmlGenericErrorFunc *pp_Var8;
  void **ppvVar9;
  xmlChar *pxVar10;
  long lVar11;
  xmlChar *sysID_00;
  uint uVar12;
  _xmlCatalogEntry *p_Var13;
  _xmlCatalogEntry *p_Var14;
  _xmlCatalogEntry *p_Var15;
  char *pcVar16;
  xmlChar *pxVar17;
  xmlChar *unaff_R13;
  ulong uVar18;
  xmlChar *delegates [50];
  int local_1dc;
  _xmlCatalogEntry *local_1d8;
  undefined8 auStack_1c8 [51];
  
  if ((catal == (xmlCatalogEntryPtr)0x0) || (pubID == (xmlChar *)0x0 && sysID == (xmlChar *)0x0)) {
    unaff_R13 = (xmlChar *)0x0;
  }
  else {
    pxVar7 = xmlCatalogNormalizePublic(pubID);
    if ((pxVar7 != (xmlChar *)0x0) && (pubID = (xmlChar *)0x0, *pxVar7 != '\0')) {
      pubID = pxVar7;
    }
    iVar5 = xmlStrncmp(pubID,(xmlChar *)"urn:publicid:",0xd);
    if (iVar5 == 0) {
      pxVar10 = xmlCatalogUnWrapURN(pubID);
      if (xmlDebugCatalogs != 0) {
        pp_Var8 = __xmlGenericError();
        p_Var2 = *pp_Var8;
        ppvVar9 = __xmlGenericErrorContext();
        if (pxVar10 == (xmlChar *)0x0) {
          pcVar16 = "Public URN ID %s expanded to NULL\n";
        }
        else {
          pcVar16 = "Public URN ID expanded to %s\n";
          pubID = pxVar10;
        }
        (*p_Var2)(*ppvVar9,pcVar16,pubID);
      }
      unaff_R13 = xmlCatalogListXMLResolve(catal,pxVar10,sysID);
      if (pxVar10 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar10);
      }
    }
    else {
      iVar5 = xmlStrncmp(sysID,(xmlChar *)"urn:publicid:",0xd);
      if (iVar5 == 0) {
        pxVar10 = xmlCatalogUnWrapURN(sysID);
        if (xmlDebugCatalogs != 0) {
          pp_Var8 = __xmlGenericError();
          p_Var2 = *pp_Var8;
          ppvVar9 = __xmlGenericErrorContext();
          if (pxVar10 == (xmlChar *)0x0) {
            pcVar16 = "System URN ID %s expanded to NULL\n";
          }
          else {
            pcVar16 = "System URN ID expanded to %s\n";
            sysID = pxVar10;
          }
          (*p_Var2)(*ppvVar9,pcVar16,sysID);
        }
        pxVar17 = pxVar10;
        if ((pubID == (xmlChar *)0x0) ||
           (iVar5 = xmlStrEqual(pubID,pxVar10), sysID_00 = pxVar10, pxVar17 = pubID, iVar5 != 0)) {
          sysID_00 = (xmlChar *)0x0;
          pubID = pxVar17;
        }
        unaff_R13 = xmlCatalogListXMLResolve(catal,pubID,sysID_00);
        if (pxVar10 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar10);
        }
      }
      else {
        do {
          if (catal->type == XML_CATA_CATALOG) {
            if (catal->children == (_xmlCatalogEntry *)0x0) {
              xmlFetchXMLCatalogFile(catal);
            }
            ctx = catal->children;
            if (ctx != (_xmlCatalogEntry *)0x0) {
              if (ctx->depth < 0x33) {
                ctx->depth = ctx->depth + 1;
                if (sysID == (xmlChar *)0x0) {
                  local_1dc = 0;
                }
                else {
                  uVar12 = 0;
                  local_1d8 = (_xmlCatalogEntry *)0x0;
                  local_1dc = 0;
                  iVar5 = 0;
                  p_Var13 = ctx;
                  do {
                    switch(p_Var13->type) {
                    case XML_CATA_NEXT_CATALOG:
                      local_1dc = local_1dc + 1;
                      break;
                    case XML_CATA_SYSTEM:
                      iVar6 = xmlStrEqual(sysID,p_Var13->name);
                      if (iVar6 != 0) {
                        if (xmlDebugCatalogs != 0) {
                          pp_Var8 = __xmlGenericError();
                          p_Var2 = *pp_Var8;
                          ppvVar9 = __xmlGenericErrorContext();
                          (*p_Var2)(*ppvVar9,"Found system match %s, using %s\n",p_Var13->name,
                                    p_Var13->URL);
                        }
                        ctx->depth = ctx->depth + -1;
                        unaff_R13 = xmlStrdup(p_Var13->URL);
                        goto LAB_0013a400;
                      }
                      break;
                    case XML_CATA_REWRITE_SYSTEM:
                      len = xmlStrlen(p_Var13->name);
                      if (((int)uVar12 < (int)len) &&
                         (iVar6 = xmlStrncmp(sysID,p_Var13->name,len), unaff_R13 = sysID, iVar6 == 0
                         )) {
                        uVar12 = len;
                        local_1d8 = p_Var13;
                      }
                      break;
                    case XML_CATA_DELEGATE_SYSTEM:
                      unaff_R13 = p_Var13->name;
                      iVar6 = xmlStrlen(unaff_R13);
                      iVar6 = xmlStrncmp(sysID,unaff_R13,iVar6);
                      iVar5 = iVar5 + (uint)(iVar6 == 0);
                    }
                    p_Var13 = p_Var13->next;
                  } while (p_Var13 != (_xmlCatalogEntry *)0x0);
                  if (local_1d8 == (_xmlCatalogEntry *)0x0) {
                    if (iVar5 == 0) {
                      bVar3 = true;
                    }
                    else {
                      uVar12 = 0;
                      p_Var13 = ctx;
                      do {
                        p_Var15 = p_Var13;
                        while (p_Var15->type == XML_CATA_DELEGATE_SYSTEM) {
                          pxVar10 = p_Var15->name;
                          iVar5 = xmlStrlen(pxVar10);
                          iVar5 = xmlStrncmp(sysID,pxVar10,iVar5);
                          if (iVar5 != 0) break;
                          p_Var14 = p_Var13;
                          if ((int)uVar12 < 1) {
LAB_0013a2db:
                            if ((int)uVar12 < 0x32) {
                              lVar11 = (long)(int)uVar12;
                              uVar12 = uVar12 + 1;
                              auStack_1c8[lVar11] = p_Var14->URL;
                            }
                            if (p_Var14->children == (_xmlCatalogEntry *)0x0) {
                              xmlFetchXMLCatalogFile(p_Var14);
                            }
                            p_Var15 = p_Var14;
                            if (p_Var14->children != (_xmlCatalogEntry *)0x0) {
                              if (xmlDebugCatalogs != 0) {
                                pp_Var8 = __xmlGenericError();
                                p_Var2 = *pp_Var8;
                                ppvVar9 = __xmlGenericErrorContext();
                                (*p_Var2)(*ppvVar9,"Trying system delegate %s\n",p_Var14->URL);
                              }
                              unaff_R13 = xmlCatalogListXMLResolve
                                                    (p_Var14->children,(xmlChar *)0x0,sysID);
                              if (unaff_R13 != (xmlChar *)0x0) goto LAB_0013a3e9;
                            }
                            break;
                          }
                          uVar18 = 0;
                          while (iVar5 = xmlStrEqual(p_Var15->URL,(xmlChar *)auStack_1c8[uVar18]),
                                iVar5 == 0) {
                            uVar18 = uVar18 + 1;
                            p_Var14 = p_Var15;
                            if (uVar12 == uVar18) goto LAB_0013a2db;
                          }
                          p_Var15 = p_Var15->next;
                          if (p_Var15 == (_xmlCatalogEntry *)0x0) goto LAB_0013a3c7;
                        }
                        p_Var13 = p_Var15->next;
                      } while (p_Var13 != (_xmlCatalogEntry *)0x0);
LAB_0013a3c7:
                      unaff_R13 = (xmlChar *)0xffffffffffffffff;
LAB_0013a3e9:
                      ctx->depth = ctx->depth + -1;
LAB_0013a400:
                      bVar3 = false;
                    }
                  }
                  else {
                    if (xmlDebugCatalogs != 0) {
                      pp_Var8 = __xmlGenericError();
                      p_Var2 = *pp_Var8;
                      ppvVar9 = __xmlGenericErrorContext();
                      (*p_Var2)(*ppvVar9,"Using rewriting rule %s\n",local_1d8->name);
                    }
                    pxVar10 = xmlStrdup(local_1d8->URL);
                    if (pxVar10 == (xmlChar *)0x0) {
                      unaff_R13 = (xmlChar *)0x0;
                    }
                    else {
                      unaff_R13 = xmlStrcat(pxVar10,sysID + uVar12);
                    }
                    ctx->depth = ctx->depth + -1;
                    bVar3 = false;
                  }
                  if (!bVar3) goto LAB_0013a660;
                }
                if (pubID != (xmlChar *)0x0) {
                  iVar5 = 0;
                  p_Var13 = ctx;
                  do {
                    xVar1 = p_Var13->type;
                    if (xVar1 == XML_CATA_NEXT_CATALOG) {
                      local_1dc = local_1dc + (uint)(sysID == (xmlChar *)0x0);
                    }
                    else if (xVar1 == XML_CATA_DELEGATE_PUBLIC) {
                      pxVar10 = p_Var13->name;
                      iVar6 = xmlStrlen(pxVar10);
                      iVar6 = xmlStrncmp(pubID,pxVar10,iVar6);
                      if (iVar6 == 0) {
                        iVar5 = iVar5 + (uint)(p_Var13->prefer == XML_CATA_PREFER_PUBLIC);
                      }
                    }
                    else if ((xVar1 == XML_CATA_PUBLIC) &&
                            (iVar6 = xmlStrEqual(pubID,p_Var13->name), iVar6 != 0)) {
                      if (xmlDebugCatalogs != 0) {
                        pp_Var8 = __xmlGenericError();
                        p_Var2 = *pp_Var8;
                        ppvVar9 = __xmlGenericErrorContext();
                        (*p_Var2)(*ppvVar9,"Found public match %s\n",p_Var13->name);
                      }
                      ctx->depth = ctx->depth + -1;
                      unaff_R13 = xmlStrdup(p_Var13->URL);
                      goto LAB_0013a660;
                    }
                    p_Var13 = p_Var13->next;
                  } while (p_Var13 != (_xmlCatalogEntry *)0x0);
                  if (iVar5 != 0) {
                    uVar12 = 0;
                    p_Var13 = ctx;
                    do {
                      p_Var15 = p_Var13;
                      while( true ) {
                        if ((p_Var15->type != XML_CATA_DELEGATE_PUBLIC) ||
                           (p_Var15->prefer != XML_CATA_PREFER_PUBLIC)) goto LAB_0013a57d;
                        pxVar10 = p_Var15->name;
                        iVar5 = xmlStrlen(pxVar10);
                        iVar5 = xmlStrncmp(pubID,pxVar10,iVar5);
                        if (iVar5 != 0) goto LAB_0013a57d;
                        p_Var14 = p_Var13;
                        if ((int)uVar12 < 1) break;
                        uVar18 = 0;
                        while (iVar5 = xmlStrEqual(p_Var15->URL,(xmlChar *)auStack_1c8[uVar18]),
                              iVar5 == 0) {
                          uVar18 = uVar18 + 1;
                          p_Var14 = p_Var15;
                          if (uVar12 == uVar18) goto LAB_0013a503;
                        }
                        p_Var15 = p_Var15->next;
                        if (p_Var15 == (_xmlCatalogEntry *)0x0) {
                          unaff_R13 = (xmlChar *)0xffffffffffffffff;
                          goto LAB_0013a64b;
                        }
                      }
LAB_0013a503:
                      if ((int)uVar12 < 0x32) {
                        lVar11 = (long)(int)uVar12;
                        uVar12 = uVar12 + 1;
                        auStack_1c8[lVar11] = p_Var14->URL;
                      }
                      if (p_Var14->children == (_xmlCatalogEntry *)0x0) {
                        xmlFetchXMLCatalogFile(p_Var14);
                      }
                      p_Var15 = p_Var14;
                      if (p_Var14->children != (_xmlCatalogEntry *)0x0) {
                        if (xmlDebugCatalogs != 0) {
                          pp_Var8 = __xmlGenericError();
                          p_Var2 = *pp_Var8;
                          ppvVar9 = __xmlGenericErrorContext();
                          (*p_Var2)(*ppvVar9,"Trying public delegate %s\n",p_Var14->URL);
                        }
                        unaff_R13 = xmlCatalogListXMLResolve(p_Var14->children,pubID,(xmlChar *)0x0)
                        ;
                        if (unaff_R13 != (xmlChar *)0x0) goto LAB_0013a64b;
                      }
LAB_0013a57d:
                      p_Var13 = p_Var15->next;
                    } while (p_Var13 != (_xmlCatalogEntry *)0x0);
                    unaff_R13 = (xmlChar *)0xffffffffffffffff;
LAB_0013a64b:
                    ctx->depth = ctx->depth + -1;
                    goto LAB_0013a660;
                  }
                }
                p_Var13 = ctx;
                if (local_1dc != 0) {
                  do {
                    if (p_Var13->type == XML_CATA_NEXT_CATALOG) {
                      if (p_Var13->children == (_xmlCatalogEntry *)0x0) {
                        xmlFetchXMLCatalogFile(p_Var13);
                      }
                      if (p_Var13->children != (xmlCatalogEntryPtr)0x0) {
                        unaff_R13 = xmlCatalogListXMLResolve(p_Var13->children,pubID,sysID);
                        if (unaff_R13 != (xmlChar *)0x0) {
                          ctx->depth = ctx->depth + -1;
                          goto LAB_0013a660;
                        }
                        if (0x32 < ctx->depth) goto LAB_0013a5ee;
                      }
                    }
                    pp_Var4 = &p_Var13->next;
                    p_Var13 = *pp_Var4;
                  } while (*pp_Var4 != (_xmlCatalogEntry *)0x0);
                }
                ctx->depth = ctx->depth + -1;
LAB_0013a5ee:
                unaff_R13 = (xmlChar *)0x0;
              }
              else {
                __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctx
                                ,(void *)0x0,0x14,0x676,XML_ERR_ERROR,(char *)0x0,0,
                                (char *)ctx->name,(char *)0x0,(char *)0x0,0,0,
                                "Detected recursion in catalog %s\n",ctx->name,0,0);
                unaff_R13 = (xmlChar *)0x0;
              }
LAB_0013a660:
              if (unaff_R13 != (xmlChar *)0x0) goto LAB_0013a734;
              if (0x32 < catal->children->depth) break;
            }
          }
          catal = catal->next;
        } while (catal != (_xmlCatalogEntry *)0x0);
        unaff_R13 = (xmlChar *)0x0;
      }
    }
LAB_0013a734:
    if (pxVar7 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar7);
    }
  }
  return unaff_R13;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;
    xmlChar *normid;

    if (catal == NULL)
        return(NULL);
    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    if (!xmlStrncmp(pubID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(pubID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"Public URN ID %s expanded to NULL\n", pubID);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"Public URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, sysID);
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    if (!xmlStrncmp(sysID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(sysID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"System URN ID %s expanded to NULL\n", sysID);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"System URN ID expanded to %s\n", urnID);
	}
	if (pubID == NULL)
	    ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	else if (xmlStrEqual(pubID, urnID))
	    ret = xmlCatalogListXMLResolve(catal, pubID, NULL);
	else {
	    ret = xmlCatalogListXMLResolve(catal, pubID, urnID);
	}
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolve(catal->children, pubID, sysID);
		if (ret != NULL) {
		    break;
                } else if (catal->children->depth > MAX_CATAL_DEPTH) {
	            ret = NULL;
		    break;
	        }
	    }
	}
	catal = catal->next;
    }
    if (normid != NULL)
	xmlFree(normid);
    return(ret);
}